

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QIBusAttribute>::emplace<QIBusAttribute>
          (QMovableArrayOps<QIBusAttribute> *this,qsizetype i,QIBusAttribute *args)

{
  QIBusAttribute **ppQVar1;
  qsizetype *pqVar2;
  QIBusAttribute *pQVar3;
  Data *pDVar4;
  long lVar5;
  qsizetype qVar6;
  QIBusAttribute *pQVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  Data *pDVar10;
  undefined8 uVar11;
  quint32 qVar12;
  quint32 qVar13;
  quint32 qVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QHash<QString,_QDBusArgument> QStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0011d8ac:
    pDVar8 = (args->super_QIBusSerializable).name.d.d;
    pcVar9 = (args->super_QIBusSerializable).name.d.ptr;
    (args->super_QIBusSerializable).name.d.d = (Data *)0x0;
    (args->super_QIBusSerializable).name.d.ptr = (char16_t *)0x0;
    qVar6 = (args->super_QIBusSerializable).name.d.size;
    (args->super_QIBusSerializable).name.d.size = 0;
    QStack_50.d = (args->super_QIBusSerializable).attachments.d;
    (args->super_QIBusSerializable).attachments.d = (Data *)0x0;
    local_48._0_4_ = args->type;
    local_48._4_4_ = args->value;
    uStack_40._0_4_ = args->start;
    uStack_40._4_4_ = args->end;
    bVar15 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.
             size != 0;
    QArrayDataPointer<QIBusAttribute>::detachAndGrow
              ((QArrayDataPointer<QIBusAttribute> *)this,(uint)(i == 0 && bVar15),1,
               (QIBusAttribute **)0x0,(QArrayDataPointer<QIBusAttribute> *)0x0);
    pQVar7 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.
             ptr;
    if (i == 0 && bVar15) {
      pQVar7[-1].super_QIBusSerializable.name.d.d = pDVar8;
      pQVar7[-1].super_QIBusSerializable.name.d.ptr = pcVar9;
      pQVar7[-1].super_QIBusSerializable.name.d.size = qVar6;
      pQVar7[-1].super_QIBusSerializable.attachments.d = QStack_50.d;
      pQVar7[-1].type = (undefined4)local_48;
      pQVar7[-1].value = local_48._4_4_;
      pQVar7[-1].start = (undefined4)uStack_40;
      pQVar7[-1].end = uStack_40._4_4_;
      ppQVar1 = &(this->super_QGenericArrayOps<QIBusAttribute>).
                 super_QArrayDataPointer<QIBusAttribute>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar3 = pQVar7 + i;
      memmove(pQVar3 + 1,pQVar7 + i,
              ((this->super_QGenericArrayOps<QIBusAttribute>).
               super_QArrayDataPointer<QIBusAttribute>.size - i) * 0x30);
      (pQVar3->super_QIBusSerializable).name.d.d = pDVar8;
      (pQVar3->super_QIBusSerializable).name.d.ptr = pcVar9;
      (pQVar3->super_QIBusSerializable).name.d.size = qVar6;
      (pQVar3->super_QIBusSerializable).attachments.d = QStack_50.d;
      pQVar3->type = (undefined4)local_48;
      pQVar3->value = local_48._4_4_;
      pQVar3->start = (undefined4)uStack_40;
      pQVar3->end = uStack_40._4_4_;
    }
    QStack_50.d = (Data *)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>
              .size;
    *pqVar2 = *pqVar2 + 1;
    QHash<QString,_QDBusArgument>::~QHash(&QStack_50);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.
            size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QIBusAttribute>).
                      super_QArrayDataPointer<QIBusAttribute>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pQVar7 = (this->super_QGenericArrayOps<QIBusAttribute>).
               super_QArrayDataPointer<QIBusAttribute>.ptr;
      pDVar8 = (args->super_QIBusSerializable).name.d.d;
      (args->super_QIBusSerializable).name.d.d = (Data *)0x0;
      pQVar7[lVar5].super_QIBusSerializable.name.d.d = pDVar8;
      pcVar9 = (args->super_QIBusSerializable).name.d.ptr;
      (args->super_QIBusSerializable).name.d.ptr = (char16_t *)0x0;
      pQVar7[lVar5].super_QIBusSerializable.name.d.ptr = pcVar9;
      qVar6 = (args->super_QIBusSerializable).name.d.size;
      (args->super_QIBusSerializable).name.d.size = 0;
      pQVar7[lVar5].super_QIBusSerializable.name.d.size = qVar6;
      pDVar10 = (args->super_QIBusSerializable).attachments.d;
      (args->super_QIBusSerializable).attachments.d = (Data *)0x0;
      pQVar7[lVar5].super_QIBusSerializable.attachments.d = pDVar10;
      qVar12 = args->value;
      uVar11 = *(undefined8 *)&args->start;
      pQVar7 = pQVar7 + lVar5;
      pQVar7->type = args->type;
      pQVar7->value = qVar12;
      *(undefined8 *)(&pQVar7->type + 2) = uVar11;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((QIBusAttribute *)
          ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.ptr
         )) goto LAB_0011d8ac;
      pQVar7 = (this->super_QGenericArrayOps<QIBusAttribute>).
               super_QArrayDataPointer<QIBusAttribute>.ptr;
      pDVar8 = (args->super_QIBusSerializable).name.d.d;
      (args->super_QIBusSerializable).name.d.d = (Data *)0x0;
      pQVar7[-1].super_QIBusSerializable.name.d.d = pDVar8;
      pcVar9 = (args->super_QIBusSerializable).name.d.ptr;
      (args->super_QIBusSerializable).name.d.ptr = (char16_t *)0x0;
      pQVar7[-1].super_QIBusSerializable.name.d.ptr = pcVar9;
      qVar6 = (args->super_QIBusSerializable).name.d.size;
      (args->super_QIBusSerializable).name.d.size = 0;
      pQVar7[-1].super_QIBusSerializable.name.d.size = qVar6;
      pDVar10 = (args->super_QIBusSerializable).attachments.d;
      (args->super_QIBusSerializable).attachments.d = (Data *)0x0;
      pQVar7[-1].super_QIBusSerializable.attachments.d = pDVar10;
      qVar12 = args->value;
      qVar13 = args->start;
      qVar14 = args->end;
      pQVar7[-1].type = args->type;
      pQVar7[-1].value = qVar12;
      pQVar7[-1].start = qVar13;
      pQVar7[-1].end = qVar14;
      ppQVar1 = &(this->super_QGenericArrayOps<QIBusAttribute>).
                 super_QArrayDataPointer<QIBusAttribute>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }